

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort uVar1;
  short sVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_10c;
  U32 minStatePlus;
  U32 maxBitsOut;
  uint s_3;
  uint total;
  BYTE s_2;
  U32 u_2;
  int freq;
  int nbOccurrences;
  U32 symbol;
  U32 position_1;
  size_t uPosition;
  size_t u_1;
  size_t unroll;
  size_t s_1;
  size_t position;
  int local_a8;
  int n;
  int i;
  U32 s;
  U64 sv;
  size_t pos;
  U64 add;
  BYTE *spread;
  U32 u;
  U32 highThreshold;
  BYTE *tableSymbol;
  U16 *cumul;
  U32 maxSV1;
  U32 step;
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCT;
  U16 *tableU16;
  void *ptr;
  U32 tableMask;
  U32 tableSize;
  size_t wkspSize_local;
  void *workSpace_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  FSE_CTable *ct_local;
  
  bVar9 = (byte)tableLog;
  uVar4 = 1 << (bVar9 & 0x1f);
  uVar5 = uVar4 - 1;
  if (tableLog == 0) {
    local_10c = 1;
  }
  else {
    local_10c = uVar4 >> 1;
  }
  uVar11 = (ulong)local_10c;
  uVar6 = (uVar4 >> 1) + (uVar4 >> 3) + 3;
  uVar7 = maxSymbolValue + 1;
  uVar10 = maxSymbolValue + 2;
  spread._4_4_ = uVar4 - 1;
  if (((ulong)workSpace & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x56,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < (((ulong)(maxSymbolValue + 2) + (1L << (bVar9 & 0x3f)) >> 1) + 2) * 4) {
    ct_local = (FSE_CTable *)0xffffffffffffffd4;
  }
  else {
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    if (0xf < tableLog) {
      __assert_fail("tableLog < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                    ,0x5b,
                    "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                   );
    }
    *(undefined2 *)workSpace = 0;
    for (spread._0_4_ = 1; (uint)spread <= uVar7; spread._0_4_ = (uint)spread + 1) {
      if (normalizedCounter[(uint)spread - 1] == -1) {
        *(short *)((long)workSpace + (ulong)(uint)spread * 2) =
             *(short *)((long)workSpace + (ulong)((uint)spread - 1) * 2) + 1;
        *(char *)((long)workSpace + (ulong)spread._4_4_ + (ulong)uVar10 * 2) =
             (char)(uint)spread + -1;
        spread._4_4_ = spread._4_4_ - 1;
      }
      else {
        if (normalizedCounter[(uint)spread - 1] < 0) {
          __assert_fail("normalizedCounter[u-1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x6c,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        *(short *)((long)workSpace + (ulong)(uint)spread * 2) =
             *(short *)((long)workSpace + (ulong)((uint)spread - 1) * 2) +
             normalizedCounter[(uint)spread - 1];
        if (*(ushort *)((long)workSpace + (ulong)(uint)spread * 2) <
            *(ushort *)((long)workSpace + (ulong)((uint)spread - 1) * 2)) {
          __assert_fail("cumul[u] >= cumul[u-1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x6e,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
    }
    *(short *)((long)workSpace + (ulong)uVar7 * 2) = (short)uVar4 + 1;
    if (spread._4_4_ == uVar4 - 1) {
      lVar3 = (ulong)uVar4 + (ulong)uVar10 * 2;
      sv = 0;
      _i = 0;
      for (n = 0; (uint)n < uVar7; n = n + 1) {
        iVar8 = (int)normalizedCounter[(uint)n];
        MEM_write64((void *)((long)workSpace + sv + lVar3),_i);
        for (local_a8 = 8; local_a8 < iVar8; local_a8 = local_a8 + 8) {
          MEM_write64((void *)((long)workSpace + (long)local_a8 + sv + lVar3),_i);
        }
        if (iVar8 < 0) {
          __assert_fail("n>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x84,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        sv = (long)iVar8 + sv;
        _i = _i + 0x101010101010101;
      }
      s_1 = 0;
      if ((uVar4 & 1) != 0) {
        __assert_fail("tableSize % unroll == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0x8f,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      for (unroll = 0; unroll < uVar4; unroll = unroll + 2) {
        for (uPosition = 0; uPosition < 2; uPosition = uPosition + 1) {
          *(undefined1 *)
           ((long)workSpace + (s_1 + uPosition * uVar6 & (ulong)uVar5) + (ulong)uVar10 * 2) =
               *(undefined1 *)((long)workSpace + unroll + uPosition + lVar3);
        }
        s_1 = s_1 + (ulong)uVar6 * 2 & (ulong)uVar5;
      }
      if (s_1 != 0) {
        __assert_fail("position == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0x98,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    else {
      nbOccurrences = 0;
      for (freq = 0; (uint)freq < uVar7; freq = freq + 1) {
        sVar2 = normalizedCounter[(uint)freq];
        for (u_2 = 0; (int)u_2 < (int)sVar2; u_2 = u_2 + 1) {
          *(char *)((long)workSpace + (ulong)(uint)nbOccurrences + (ulong)uVar10 * 2) = (char)freq;
          do {
            nbOccurrences = nbOccurrences + uVar6 & uVar5;
          } while (spread._4_4_ < (uint)nbOccurrences);
        }
      }
      if (nbOccurrences != 0) {
        __assert_fail("position==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0xa6,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    for (total = 0; total < uVar4; total = total + 1) {
      uVar12 = (ulong)*(byte *)((long)workSpace + (ulong)total + (ulong)uVar10 * 2);
      uVar1 = *(ushort *)((long)workSpace + uVar12 * 2);
      *(ushort *)((long)workSpace + uVar12 * 2) = uVar1 + 1;
      *(short *)((long)ct + (ulong)uVar1 * 2 + 4) = (short)uVar4 + (short)total;
    }
    maxBitsOut = 0;
    for (minStatePlus = 0; minStatePlus <= maxSymbolValue; minStatePlus = minStatePlus + 1) {
      sVar2 = normalizedCounter[minStatePlus];
      if (sVar2 == -1) {
LAB_0040b398:
        ct[uVar11 + (ulong)minStatePlus * 2 + 2] = tableLog * 0x10000 - (1 << (bVar9 & 0x1f));
        if (0x7fffffff < maxBitsOut) {
          __assert_fail("total <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xbd,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        ct[uVar11 + (ulong)minStatePlus * 2 + 1] = maxBitsOut - 1;
        maxBitsOut = maxBitsOut + 1;
      }
      else if (sVar2 == 0) {
        ct[uVar11 + (ulong)minStatePlus * 2 + 2] = (tableLog + 1) * 0x10000 - (1 << (bVar9 & 0x1f));
      }
      else {
        if (sVar2 == 1) goto LAB_0040b398;
        if (normalizedCounter[minStatePlus] < 2) {
          __assert_fail("normalizedCounter[s] > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xc2,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar4 = ZSTD_highbit32((int)normalizedCounter[minStatePlus] - 1);
        ct[uVar11 + (ulong)minStatePlus * 2 + 2] =
             (tableLog - uVar4) * 0x10000 -
             ((int)normalizedCounter[minStatePlus] << ((byte)(tableLog - uVar4) & 0x1f));
        ct[uVar11 + (ulong)minStatePlus * 2 + 1] = maxBitsOut - (int)normalizedCounter[minStatePlus]
        ;
        maxBitsOut = (int)normalizedCounter[minStatePlus] + maxBitsOut;
      }
    }
    ct_local = (FSE_CTable *)0x0;
  }
  return (size_t)ct_local;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}